

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::CheckZones(SFFile *this,int start,int stop,bool instr)

{
  SFBag *pSVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  SFGenerator SVar5;
  SFBag *pSVar6;
  SFGenList *pSVar7;
  SFBag *pSVar8;
  SFRange SVar9;
  SFGenerator SVar10;
  undefined3 in_register_00000009;
  ushort uVar11;
  uchar temp;
  int i;
  long lVar12;
  SFBag **ppSVar13;
  SFGenList **ppSVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  
  bVar18 = CONCAT31(in_register_00000009,instr) != 0;
  SVar10 = 0x29;
  ppSVar14 = &this->PresetGenerators;
  if (bVar18) {
    SVar10 = 0x35;
    ppSVar14 = &this->InstrGenerators;
  }
  ppSVar13 = &this->InstrBags;
  if (!bVar18) {
    ppSVar13 = &this->PresetBags;
  }
  if (start < stop) {
    pSVar6 = *ppSVar13;
    pSVar7 = *ppSVar14;
    lVar12 = (long)start;
    pSVar1 = pSVar6 + lVar12;
    lVar15 = lVar12;
    uVar11 = pSVar1->GenIndex;
    do {
      uVar4 = pSVar6[lVar15 + 1].GenIndex;
      if (uVar4 < uVar11) {
        pSVar8 = pSVar6 + lVar15;
        (pSVar8->KeyRange).Lo = 0xff;
        (pSVar8->KeyRange).Hi = 0xff;
        (pSVar8->VelRange).Lo = 0xff;
        (pSVar8->VelRange).Hi = 0xff;
      }
      else {
        if ((lVar15 != lVar12) && (pSVar1->Target < 0)) {
          SVar9 = pSVar1->VelRange;
          pSVar6[lVar15].KeyRange = pSVar1->KeyRange;
          pSVar6[lVar15].VelRange = SVar9;
        }
        if (uVar11 < uVar4) {
          uVar16 = (ulong)uVar11;
          do {
            SVar5 = pSVar7[uVar16].Oper;
            if (SVar5 == 0x2c) {
              pSVar6[lVar15].VelRange = (SFRange)pSVar7[uVar16].field_1;
            }
            else if (SVar5 == 0x2b) {
              pSVar6[lVar15].KeyRange = (SFRange)pSVar7[uVar16].field_1;
            }
            else if (SVar10 == SVar5) {
              if (instr) {
                iVar17 = this->NumSamples;
              }
              else {
                iVar17 = this->NumInstruments;
              }
              if ((int)(uint)pSVar7[uVar16].field_1.uAmount < iVar17 + -1) {
                pSVar6[lVar15].Target = (uint)pSVar7[uVar16].field_1.uAmount;
              }
              break;
            }
            uVar16 = uVar16 + 1;
          } while (uVar4 != uVar16);
        }
        if ((lVar15 == lVar12) || (-1 < pSVar6[lVar15].Target)) {
          bVar2 = pSVar6[lVar15].KeyRange.Lo;
          bVar3 = pSVar6[lVar15].KeyRange.Hi;
          if (bVar3 < bVar2) {
            pSVar6[lVar15].KeyRange.Lo = bVar3;
            pSVar6[lVar15].KeyRange.Hi = bVar2;
          }
        }
        else {
          pSVar8 = pSVar6 + lVar15;
          (pSVar8->KeyRange).Lo = 0xff;
          (pSVar8->KeyRange).Hi = 0xff;
          (pSVar8->VelRange).Lo = 0xff;
          (pSVar8->VelRange).Hi = 0xff;
        }
        bVar2 = pSVar6[lVar15].VelRange.Lo;
        bVar3 = pSVar6[lVar15].VelRange.Hi;
        if (bVar3 < bVar2) {
          pSVar6[lVar15].VelRange.Lo = bVar3;
          pSVar6[lVar15].VelRange.Hi = bVar2;
        }
      }
      lVar15 = lVar15 + 1;
      uVar11 = uVar4;
    } while (lVar15 != stop);
  }
  return;
}

Assistant:

void SFFile::CheckZones(int start, int stop, bool instr)
{
	SFBag *bag;
	SFGenList *gens;
	SFGenerator terminal_gen;
	int zone_start, zone_stop;
	int i, j;

	if (!instr)
	{
		bag = PresetBags;
		gens = PresetGenerators;
		terminal_gen = GEN_instrument;
	}
	else
	{
		bag = InstrBags;
		gens = InstrGenerators;
		terminal_gen = GEN_sampleID;
	}
	for (i = start; i < stop; ++i)
	{
		zone_start = bag[i].GenIndex;
		zone_stop = bag[i + 1].GenIndex;

		if (zone_start > zone_stop)
		{
			// Skip empty zones, and mark them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
			continue;
		}

		// According to the specs, if keyRange is present, it must be the first generator.
		// If velRange is present, it may only be preceded by keyRange. In real life, there
		// exist Soundfonts that violate this rule, so we need to scan every generator.

		// Preload ranges from the global zone.
		if (i != start && bag[start].Target < 0)
		{
			bag[i].KeyRange = bag[start].KeyRange;
			bag[i].VelRange = bag[start].VelRange;
		}
		for (j = zone_start; j < zone_stop; ++j)
		{
			if (gens[j].Oper == GEN_keyRange)
			{
				bag[i].KeyRange = gens[j].Range;
			}
			else if (gens[j].Oper == GEN_velRange)
			{
				bag[i].VelRange = gens[j].Range;
			}
			else if (gens[j].Oper == terminal_gen)
			{
				if (terminal_gen == GEN_instrument && gens[j].uAmount < NumInstruments - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				else if (terminal_gen == GEN_sampleID && gens[j].uAmount < NumSamples - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				break;
			}
		}
		if (bag[i].Target < 0 && i != start)
		{
			// Only the first zone may be targetless. If any other zones are,
			// make them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
		}

		// Check for swapped ranges. (Should we fix them or ignore them?)
		if (bag[i].KeyRange.Lo > bag[i].KeyRange.Hi)
		{
			swapvalues(bag[i].KeyRange.Lo, bag[i].KeyRange.Hi);
		}
		if (bag[i].VelRange.Lo > bag[i].VelRange.Hi)
		{
			swapvalues(bag[i].VelRange.Lo, bag[i].VelRange.Hi);
		}
	}
}